

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_queue_examples.cpp
# Opt level: O3

void density_tests::conc_heterogeneous_queue_put_transaction_samples(void)

{
  void *i_data;
  bool bVar1;
  int *piVar2;
  Msg *pMVar3;
  ostream *poVar4;
  runtime_type<> *prVar5;
  type_info *ptVar6;
  size_t sVar7;
  double *pdVar8;
  size_t i_len;
  size_t i_len_00;
  char *pcVar9;
  put_transaction<int> transaction1;
  type transaction2;
  put_transaction<void> transaction;
  int msg_2;
  int value_2;
  int value;
  undefined1 local_168 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phStack_160;
  put_transaction<void> local_158;
  undefined1 local_138 [9];
  uint7 uStack_12f;
  put_transaction<int> local_128;
  __native_type local_108;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_e0;
  undefined1 local_c8 [8];
  reentrant_put_transaction<double> rStack_c0;
  void *pvStack_a8;
  double local_98;
  undefined4 local_8c;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *local_88;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phStack_80;
  reentrant_put_transaction<double> local_78;
  put_transaction<int> local_58;
  
  local_108.__align = 0;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._16_8_ = 0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)&local_108.__data);
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_c8._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_138,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_108.__data,(int *)local_c8);
  local_168 = (undefined1  [8])local_138._0_8_;
  phStack_160._0_1_ = local_138[8];
  local_138._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  stack0xfffffffffffffed0 =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       ((ulong)stack0xfffffffffffffed0 & 0xffffffffffffff00);
  local_158.m_queue = local_128.m_queue;
  local_158.m_put_data.m_control_block = local_128.m_put_data.m_control_block;
  local_158.m_put_data.m_user_storage = local_128.m_put_data.m_user_storage;
  local_128.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
  local_138._0_8_ = local_168;
  local_138[8] = phStack_160._0_1_;
  local_168 = (undefined1  [8])0x0;
  phStack_160._0_1_ = false;
  local_128.m_queue = local_158.m_queue;
  local_128.m_put_data.m_control_block = local_158.m_put_data.m_control_block;
  local_128.m_put_data.m_user_storage = local_158.m_put_data.m_user_storage;
  local_158.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  piVar2 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  put_transaction<int>::element_ptr(&local_128);
  if (*piVar2 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x9e,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)local_138);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_128.m_queue !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xa2,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_168);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_c8._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_138,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_108.__data,(int *)local_c8);
  local_168 = (undefined1  [8])local_138._0_8_;
  phStack_160 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                CONCAT71(phStack_160._1_7_,local_138[8]);
  local_138._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_138[8] = false;
  local_158.m_queue = local_128.m_queue;
  local_158.m_put_data.m_control_block = local_128.m_put_data.m_control_block;
  local_158.m_put_data.m_user_storage = local_128.m_put_data.m_user_storage;
  local_128.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
  local_138._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  stack0xfffffffffffffed0 =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       ((ulong)uStack_12f << 8);
  local_128.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=
            ((put_transaction<void> *)local_138,(put_transaction<int> *)local_168);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_158.m_queue !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xcc,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::commit((put_transaction<void> *)local_138);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_128.m_queue !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xce,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_138);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_168);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  std::chrono::_V2::system_clock::now();
  local_138._0_4_ = 0x2a;
  local_c8._0_4_ = 0x237;
  conc_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_108.__data,local_138,i_len);
  conc_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_108.__data,local_c8,i_len_00);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((consume_operation *)local_168,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_108.__data);
  if (local_158.m_put_data.m_control_block != (ControlBlock *)0x0) {
    do {
      pMVar3 = density::
               conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
               consume_operation::
               element<density_tests::conc_heterogeneous_queue_put_transaction_samples()::Msg>
                         ((consume_operation *)local_168);
      i_data = pMVar3->m_data;
      pMVar3 = density::
               conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
               consume_operation::
               element<density_tests::conc_heterogeneous_queue_put_transaction_samples()::Msg>
                         ((consume_operation *)local_168);
      compute_checksum(i_data,pMVar3->m_len);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Message with checksum ",0x16);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," at ",4);
      density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      consume_operation::
      element<density_tests::conc_heterogeneous_queue_put_transaction_samples()::Msg>
                ((consume_operation *)local_168);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
      ::consume_operation::commit((consume_operation *)local_168);
      density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
      ::consume_operation::~consume_operation((consume_operation *)local_168);
      density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
      ::try_start_consume((consume_operation *)local_168,
                          (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&local_108.__data);
    } while (local_158.m_put_data.m_control_block != (ControlBlock *)0x0);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_168);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_168 = (undefined1  [8])0x0;
  phStack_160 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                ((ulong)phStack_160 & 0xffffffffffffff00);
  local_158.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_c8._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_138,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_108.__data,(int *)local_c8);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=
            ((put_transaction<void> *)local_168,(put_transaction<int> *)local_138);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_158.m_queue ==
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x145,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_168);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_168 = (undefined1  [8])0x0;
  phStack_160 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                ((ulong)phStack_160 & 0xffffffffffffff00);
  local_158.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_c8._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_138,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_108.__data,(int *)local_c8);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=
            ((put_transaction<void> *)local_168,(put_transaction<int> *)local_138);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_158.m_queue ==
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x14f,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_168);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_108.__data);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x157,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  local_c8._0_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_138,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_108.__data,(int *)local_c8);
  local_168 = (undefined1  [8])local_138._0_8_;
  phStack_160._0_1_ = local_138[8];
  local_138._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  stack0xfffffffffffffed0 =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       ((ulong)stack0xfffffffffffffed0 & 0xffffffffffffff00);
  local_158.m_queue = local_128.m_queue;
  local_158.m_put_data.m_control_block = local_128.m_put_data.m_control_block;
  local_158.m_put_data.m_user_storage = local_128.m_put_data.m_user_storage;
  local_128.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_158.m_queue ==
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x15b,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::cancel((put_transaction<int> *)local_168);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_108.__data);
  if ((!bVar1) ||
     ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_158.m_queue !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0)) {
    __assert_fail("queue.empty() && put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x15d,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  local_c8._0_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_138,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_108.__data,(int *)local_c8);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::operator=
            ((put_transaction<int> *)local_168,(put_transaction<int> *)local_138);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)local_168);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((consume_operation *)local_138,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_108.__data);
  piVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element<int>((consume_operation *)&local_128);
  if (*piVar2 != 0x2a) {
    __assert_fail("queue.try_start_consume().element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x162,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_138);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_168);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_e0);
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_78.m_queue._0_4_ = 0x2a;
  local_c8 = (undefined1  [8])
             density::detail::
             FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
             ::s_table;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_dyn_push_copy((put_transaction<void> *)local_138,
                      (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_108.__data,(runtime_type *)local_c8,&local_78);
  local_168 = (undefined1  [8])local_138._0_8_;
  phStack_160._0_1_ = local_138[8];
  local_138._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  stack0xfffffffffffffed0 =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       ((ulong)stack0xfffffffffffffed0 & 0xffffffffffffff00);
  local_158.m_queue = local_128.m_queue;
  local_158.m_put_data.m_control_block = local_128.m_put_data.m_control_block;
  local_158.m_put_data.m_user_storage = local_128.m_put_data.m_user_storage;
  local_128.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_138);
  piVar2 = (int *)density::
                  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                  ::put_transaction<void>::element_ptr((put_transaction<void> *)local_168);
  if (*piVar2 == 0x2a) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Putting an ",0xb);
    prVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             put_transaction<void>::complete_type(&local_158);
    ptVar6 = density::runtime_type<>::type_info(prVar5);
    pcVar9 = *(char **)(ptVar6 + 8) + (**(char **)(ptVar6 + 8) == '*');
    sVar7 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::commit((put_transaction<void> *)local_168);
    local_98 = (double)CONCAT44(local_98._4_4_,1);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_push<int>((put_transaction<int> *)local_c8,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_108.__data,(int *)&local_98);
    local_138._0_8_ = local_c8;
    local_138[8] = rStack_c0.m_queue._0_1_;
    local_c8 = (undefined1  [8])0x0;
    rStack_c0.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         ((ulong)rStack_c0.m_queue & 0xffffffffffffff00);
    local_128.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         rStack_c0.m_put_data.m_control_block;
    local_128.m_put_data.m_control_block = (ControlBlock *)rStack_c0.m_put_data.m_user_storage;
    local_128.m_put_data.m_user_storage = pvStack_a8;
    rStack_c0.m_put_data.m_control_block = (ControlBlock *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::~put_transaction((put_transaction<int> *)local_c8);
    piVar2 = (int *)density::
                    conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::put_transaction<int>::element_ptr((put_transaction<int> *)local_138);
    if (*piVar2 != 1) {
      __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                    ,0x172,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()")
      ;
    }
    piVar2 = (int *)density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::put_transaction<int>::element_ptr(&local_128);
    if (*piVar2 != 1) {
      __assert_fail("put_1.element() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                    ,0x173,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()")
      ;
    }
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::commit((put_transaction<int> *)local_138);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::~put_transaction((put_transaction<int> *)local_138);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::~put_transaction((put_transaction<void> *)local_168);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&local_e0);
    local_108._16_8_ = 0;
    local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_108.__align = 0;
    local_108._8_8_ = 0;
    local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
    local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
    local_78.m_queue =
         (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         CONCAT44(local_78.m_queue._4_4_,0x2a);
    local_c8 = (undefined1  [8])
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_dyn_push_copy((put_transaction<void> *)local_138,
                        (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)&local_108.__data,(runtime_type *)local_c8,&local_78);
    local_168 = (undefined1  [8])local_138._0_8_;
    phStack_160 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)CONCAT71(phStack_160._1_7_,local_138[8]);
    local_138._0_8_ =
         (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         0x0;
    stack0xfffffffffffffed0 =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         ((ulong)uStack_12f << 8);
    local_158.m_queue = local_128.m_queue;
    local_158.m_put_data.m_control_block = local_128.m_put_data.m_control_block;
    local_158.m_put_data.m_user_storage = local_128.m_put_data.m_user_storage;
    local_128.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::~put_transaction((put_transaction<void> *)local_138);
    prVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             put_transaction<void>::complete_type(&local_158);
    if (prVar5->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      __assert_fail("put.complete_type().is<int>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                    ,0x17c,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()")
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Putting an ",0xb);
    prVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             put_transaction<void>::complete_type(&local_158);
    ptVar6 = density::runtime_type<>::type_info(prVar5);
    pcVar9 = *(char **)(ptVar6 + 8) + (**(char **)(ptVar6 + 8) == '*');
    sVar7 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::~put_transaction((put_transaction<void> *)local_168);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&local_e0);
    local_108._16_8_ = 0;
    local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_108.__align = 0;
    local_108._8_8_ = 0;
    local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
    local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
    local_168._0_4_ = 0x2a;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_push<int>(&local_58,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_108.__data,(int *)local_168);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::~put_transaction(&local_58);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&local_e0);
    local_108._16_8_ = 0;
    local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_108.__align = 0;
    local_108._8_8_ = 0;
    local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_e0.m_head = (ControlBlock *)&DAT_0000ffef;
    local_e0.m_tail = (ControlBlock *)&DAT_0000ffef;
    local_8c = 0x2a;
    local_c8 = (undefined1  [8])
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)local_168,
               (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                *)&local_108.__data,(runtime_type *)local_c8,&local_8c);
    local_138._0_8_ = local_168;
    stack0xfffffffffffffed0 = phStack_160;
    local_128.m_queue = local_158.m_queue;
    local_128.m_put_data.m_control_block = local_158.m_put_data.m_control_block;
    local_168 = (undefined1  [8])0x0;
    phStack_160 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)local_168);
    local_98 = 42.0;
    density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    start_reentrant_emplace<double,double>
              ((reentrant_put_transaction<double> *)local_168,
               (conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                *)&local_108.__data,&local_98);
    local_88 = (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                *)local_168;
    phStack_80 = phStack_160;
    local_78.m_put_transaction.m_put_data.m_control_block = (ControlBlock *)local_158.m_queue;
    local_78.m_put_transaction.m_put_data.m_user_storage = local_158.m_put_data.m_control_block;
    local_168 = (undefined1  [8])0x0;
    phStack_160 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<double>::~reentrant_put_transaction
              ((reentrant_put_transaction<double> *)local_168);
    local_c8 = (undefined1  [8])local_88;
    rStack_c0.m_queue = phStack_80;
    rStack_c0.m_put_data.m_control_block = local_78.m_put_transaction.m_put_data.m_control_block;
    rStack_c0.m_put_data.m_user_storage = local_78.m_put_transaction.m_put_data.m_user_storage;
    local_78.m_queue =
         (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         0x0;
    local_78.m_put_transaction.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<double>::~reentrant_put_transaction(&local_78);
    pdVar8 = (double *)
             density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_put_transaction<double>::element_ptr(&rStack_c0);
    if ((*pdVar8 == 42.0) && (!NAN(*pdVar8))) {
      density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
      ::reentrant_put_transaction<double>::~reentrant_put_transaction
                ((reentrant_put_transaction<double> *)local_c8);
      density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
      ::reentrant_put_transaction<void>::~reentrant_put_transaction
                ((reentrant_put_transaction<void> *)local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_e0);
      return;
    }
    __assert_fail("typed_put.element() == 42.",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x195,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                ,0x16a,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
}

Assistant:

void conc_heterogeneous_queue_put_transaction_samples()
    {
        using namespace density;
        {
            //! [conc_heter_queue put_transaction default_construct example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(transaction.empty());
            //! [conc_heter_queue put_transaction default_construct example 1]
        }
        {
            //! [conc_heter_queue put_transaction copy_construct example 1]
            static_assert(
              !std::is_copy_constructible<conc_heter_queue<>::put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_constructible<conc_heter_queue<int>::put_transaction<>>::value, "");
            //! [conc_heter_queue put_transaction copy_construct example 1]
        }
        {
            //! [conc_heter_queue put_transaction copy_assign example 1]
            static_assert(
              !std::is_copy_assignable<conc_heter_queue<>::put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_assignable<conc_heter_queue<int>::put_transaction<>>::value, "");
            //! [conc_heter_queue put_transaction copy_assign example 1]
        }
        {
            //! [conc_heter_queue put_transaction move_construct example 1]
            conc_heter_queue<> queue;
            auto               transaction1 = queue.start_push(1);

            // move from transaction1 to transaction2
            auto transaction2(std::move(transaction1));
            assert(transaction1.empty());
            assert(transaction2.element() == 1);

            // commit transaction2
            transaction2.commit();
            assert(transaction2.empty());

            //! [conc_heter_queue put_transaction move_construct example 1]

            //! [conc_heter_queue put_transaction move_construct example 2]
            // put_transaction<void> can be move constructed from any put_transaction<T>
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");

            // put_transaction<T> can be move constructed only from put_transaction<T>
            static_assert(
              !std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");
            //! [conc_heter_queue put_transaction move_construct example 2]
        }
        {
            //! [conc_heter_queue put_transaction move_assign example 1]
            conc_heter_queue<> queue;
            auto               transaction1 = queue.start_push(1);

            conc_heter_queue<>::put_transaction<> transaction2;
            transaction2 = std::move(transaction1);
            assert(transaction1.empty());
            transaction2.commit();
            assert(transaction2.empty());
            //! [conc_heter_queue put_transaction move_assign example 1]

            //! [conc_heter_queue put_transaction move_assign example 2]
            // put_transaction<void> can be move assigned from any put_transaction<T>
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");

            // put_transaction<T> can be move assigned only from put_transaction<T>
            static_assert(
              !std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");
            //! [conc_heter_queue put_transaction move_assign example 2]
        }
        {
            //! [conc_heter_queue put_transaction raw_allocate example 1]
            conc_heter_queue<> queue;
            struct Msg
            {
                std::chrono::high_resolution_clock::time_point m_time =
                  std::chrono::high_resolution_clock::now();
                size_t m_len  = 0;
                void * m_data = nullptr;
            };

            auto post_message = [&queue](const void * i_data, size_t i_len) {
                auto transaction             = queue.start_emplace<Msg>();
                transaction.element().m_len  = i_len;
                transaction.element().m_data = transaction.raw_allocate(i_len, 1);
                memcpy(transaction.element().m_data, i_data, i_len);

                assert(
                  !transaction
                     .empty()); // a put transaction is not empty if it's bound to an element being put
                transaction.commit();
                assert(transaction.empty()); // the commit makes the transaction empty
            };

            auto const start_time = std::chrono::high_resolution_clock::now();

            auto consume_all_msgs = [&queue, &start_time] {
                while (auto consume = queue.try_start_consume())
                {
                    auto const checksum =
                      compute_checksum(consume.element<Msg>().m_data, consume.element<Msg>().m_len);
                    std::cout << "Message with checksum " << checksum << " at ";
                    std::cout << (consume.element<Msg>().m_time - start_time).count() << std::endl;
                    consume.commit();
                }
            };

            int msg_1 = 42, msg_2 = 567;
            post_message(&msg_1, sizeof(msg_1));
            post_message(&msg_2, sizeof(msg_2));

            consume_all_msgs();
            //! [conc_heter_queue put_transaction raw_allocate example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction raw_allocate_copy example 1]
            struct Msg
            {
                size_t m_len   = 0;
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const char * i_data, size_t i_len) {
                auto transaction            = queue.start_emplace<Msg>();
                transaction.element().m_len = i_len;
                transaction.element().m_chars =
                  transaction.raw_allocate_copy(i_data, i_data + i_len);
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            };
            //! [conc_heter_queue put_transaction raw_allocate_copy example 1]
            (void)post_message;
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction raw_allocate_copy example 2]
            struct Msg
            {
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const std::string & i_string) {
                auto transaction              = queue.start_emplace<Msg>();
                transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
                transaction.commit();
            };
            //! [conc_heter_queue put_transaction raw_allocate_copy example 2]
            (void)post_message;
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction empty example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(transaction.empty());

            transaction = queue.start_push(1);
            assert(!transaction.empty());
            //! [conc_heter_queue put_transaction empty example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction operator_bool example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(!transaction);

            transaction = queue.start_push(1);
            assert(transaction);
            //! [conc_heter_queue put_transaction operator_bool example 1]
        }
        {
            //! [conc_heter_queue put_transaction cancel example 1]
            conc_heter_queue<> queue;

            // start and cancel a put
            assert(queue.empty());
            auto put = queue.start_push(42);
            /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
        the queue during a non-reentrant put transaction. */
            assert(!put.empty());
            put.cancel();
            assert(queue.empty() && put.empty());

            // start and commit a put
            put = queue.start_push(42);
            put.commit();
            assert(queue.try_start_consume().element<int>() == 42);
            //! [conc_heter_queue put_transaction cancel example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction element_ptr example 1]
            int  value = 42;
            auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(*static_cast<int *>(put.element_ptr()) == 42);
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            put.commit();
            //! [conc_heter_queue put_transaction element_ptr example 1]

            //! [conc_heter_queue put_transaction element_ptr example 2]
            auto put_1 = queue.start_push(1);
            assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
            assert(put_1.element() == 1);                          // this is better
            put_1.commit();
            //! [conc_heter_queue put_transaction element_ptr example 2]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction complete_type example 1]
            int  value = 42;
            auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(put.complete_type().is<int>());
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            //! [conc_heter_queue put_transaction complete_type example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction destroy example 1]
            queue.start_push(42); /* this transaction is destroyed without being committed,
                            so it gets canceled automatically. */
            //! [conc_heter_queue put_transaction destroy example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue typed_put_transaction element example 1]

            int  value = 42;
            auto untyped_put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

            auto typed_put = queue.start_reentrant_push(42.);

            /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
        transaction to a typed transaction */

            assert(typed_put.element() == 42.);

            //! [conc_heter_queue typed_put_transaction element example 1]
        }
    }